

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitElem
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayInitElem *curr,
          optional<wasm::HeapType> ht)

{
  _Storage<wasm::HeapType,_true> heapType;
  Type local_30;
  
  heapType = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  if (((undefined1  [16])
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    heapType._M_value = wasm::Type::getHeapType(&curr->ref->type);
  }
  wasm::Type::Type(&local_30,heapType._M_value,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->ref,local_30);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->index,(Type)0x2);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->offset,(Type)0x2);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->size,(Type)0x2);
  return;
}

Assistant:

void visitArrayInitElem(ArrayInitElem* curr,
                          std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    note(&curr->ref, Type(*ht, Nullable));
    note(&curr->index, Type::i32);
    note(&curr->offset, Type::i32);
    note(&curr->size, Type::i32);
  }